

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiColumnTotalSize(Fts5Context *pCtx,int iCol,sqlite3_int64 *pnToken)

{
  uint uVar1;
  Fts5Storage *p;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  p = *(Fts5Storage **)(*(long *)pCtx + 0x28);
  iVar2 = fts5StorageLoadTotals(p,0);
  if (iVar2 == 0) {
    *pnToken = 0;
    uVar1 = p->pConfig->nCol;
    if (iCol < 0) {
      iVar2 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = 0;
      }
      lVar4 = 0;
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        lVar4 = lVar4 + p->aTotalSize[uVar5];
        *pnToken = lVar4;
      }
    }
    else if (iCol < (int)uVar1) {
      *pnToken = p->aTotalSize[(uint)iCol];
      iVar2 = 0;
    }
    else {
      iVar2 = 0x19;
    }
  }
  return iVar2;
}

Assistant:

static int fts5ApiColumnTotalSize(
  Fts5Context *pCtx, 
  int iCol, 
  sqlite3_int64 *pnToken
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  return sqlite3Fts5StorageSize(pTab->pStorage, iCol, pnToken);
}